

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_player_prop_bindui(parser *p)

{
  wchar_t wVar1;
  int iVar2;
  char *pcVar3;
  char *local_50;
  char *end;
  long v;
  player_bound_ui *boundui;
  embryo_player_ability *embryo;
  char *pcStack_28;
  _Bool isaux;
  char *value;
  char *name;
  parser *p_local;
  
  name = (char *)p;
  value = parser_getsym(p,"ui");
  pcStack_28 = parser_getsym((parser *)name,"uival");
  wVar1 = parser_getint((parser *)name,"aux");
  embryo._7_1_ = wVar1 != L'\0';
  boundui = (player_bound_ui *)parser_priv((parser *)name);
  if (boundui == (player_bound_ui *)0x0) {
    return PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  v = (long)mem_alloc(0x18);
  pcVar3 = string_make(value);
  *(char **)v = pcVar3;
  iVar2 = strcmp(pcStack_28,"special");
  if (iVar2 == 0) {
    *(undefined4 *)(v + 0x10) = 0;
    *(undefined1 *)(v + 0x15) = 1;
  }
  else {
    end = (char *)strtol(pcStack_28,&local_50,10);
    if ((*pcStack_28 == '\0') || (*local_50 != '\0')) {
      string_free(*(char **)v);
      mem_free((void *)v);
      return PARSE_ERROR_NOT_NUMBER;
    }
    if (((long)end < -0x7fffffff) || (0x7ffffffe < (long)end)) {
      string_free(*(char **)v);
      mem_free((void *)v);
      return PARSE_ERROR_INVALID_VALUE;
    }
    *(int *)(v + 0x10) = (int)end;
    *(undefined1 *)(v + 0x15) = 0;
  }
  *(byte *)(v + 0x14) = embryo._7_1_ & 1;
  *(char **)(v + 8) = boundui[2].name;
  boundui[2].name = (char *)v;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_player_prop_bindui(struct parser *p) {
	const char *name = parser_getsym(p, "ui");
	const char *value = parser_getsym(p, "uival");
	bool isaux = (parser_getint(p, "aux") != 0);
	struct embryo_player_ability *embryo = parser_priv(p);
	struct player_bound_ui *boundui;
	if (!embryo)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	boundui = mem_alloc(sizeof(*boundui));
	boundui->name = string_make(name);
	if (streq(value, "special")) {
		boundui->value = 0;
		boundui->isspecial = true;
	} else {
		long v;
		char* end;

		v = strtol(value, &end, 10);
		if (! *value || *end) {
			string_free(boundui->name);
			mem_free(boundui);
			return PARSE_ERROR_NOT_NUMBER;
		}
		/*
		 * Also reject INT_MIN and INT_MAX so we don't have to check
		 * errno to detect out of range values on platforms where
		 * sizeof(int) == sizeof(long).
		 */
		if (v <= INT_MIN || v >= INT_MAX) {
			string_free(boundui->name);
			mem_free(boundui);
			return PARSE_ERROR_INVALID_VALUE;
		}
		boundui->value = (int) v;
		boundui->isspecial = false;
	}
	boundui->isaux = isaux;
	boundui->next = embryo->boundui;
	embryo->boundui = boundui;
	return PARSE_ERROR_NONE;
}